

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode SafeProcessCommands(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  byte *pbVar4;
  BackwardReferenceFromDecoder *pBVar5;
  BrotliDictionary *pBVar6;
  BrotliTransforms *pBVar7;
  undefined8 uVar8;
  byte *pbVar9;
  BrotliDecoderErrorCode BVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  byte *pbVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  HuffmanCode *pHVar22;
  byte bVar23;
  uint uVar24;
  size_t sVar25;
  uint8_t *puVar26;
  uint64_t uVar27;
  uint uVar28;
  byte *pbVar29;
  uint uVar30;
  byte bVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  uint32_t cmd_code;
  uint local_4c;
  byte *local_48;
  size_t local_40;
  byte *local_38;
  
  if (3 < s->state - BROTLI_STATE_COMMAND_BEGIN) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  uVar28 = s->pos;
  uVar34 = (ulong)uVar28;
  uVar30 = s->loop_counter;
  uVar13 = (ulong)uVar30;
  br = &s->br;
  switch(s->state) {
  case BROTLI_STATE_COMMAND_INNER:
    goto LAB_00104dda;
  case BROTLI_STATE_COMMAND_POST_DECODE_LITERALS:
    goto switchD_00104ae4_caseD_9;
  case BROTLI_STATE_COMMAND_POST_WRAP_COPY:
    lVar11 = (long)(int)uVar28;
    goto LAB_001054d7;
  }
switchD_00104ae4_caseD_7:
  do {
    uVar30 = (uint)uVar13;
    s->state = BROTLI_STATE_COMMAND_BEGIN;
    if (s->block_length[1] != 0) {
      uVar13 = (s->br).val_;
      uVar16 = (s->br).bit_pos_;
      local_38 = (s->br).next_in;
      local_40 = (s->br).avail_in;
      pHVar22 = s->htree_command;
      uVar28 = uVar16 - 0x32;
      uVar12 = uVar13;
      uVar15 = uVar16;
      pbVar4 = local_38;
      sVar25 = local_40;
      while (uVar28 < 0xf) {
        sVar25 = sVar25 - 1;
        if (sVar25 == 0xffffffffffffffff) {
          iVar32 = SafeDecodeSymbol(pHVar22,br,&local_4c);
          if (iVar32 != 0) goto LAB_00104c10;
          goto LAB_00104d63;
        }
        (s->br).val_ = uVar12 >> 8;
        uVar12 = uVar12 >> 8 | (ulong)*pbVar4 << 0x38;
        (s->br).val_ = uVar12;
        (s->br).bit_pos_ = uVar15 - 8;
        (s->br).avail_in = sVar25;
        (s->br).next_in = pbVar4 + 1;
        uVar28 = uVar15 - 0x3a;
        uVar15 = uVar15 - 8;
        pbVar4 = pbVar4 + 1;
      }
      uVar12 = uVar12 >> ((byte)uVar15 & 0x3f);
      pHVar22 = pHVar22 + (uVar12 & 0xff);
      uVar28 = (uint)pHVar22->bits;
      if (8 < uVar28) {
        uVar15 = uVar15 + 8;
        pHVar22 = pHVar22 + (((uint)(uVar12 >> 8) & 0xffffff & kBitMask[pHVar22->bits - 8] & 0x7f) +
                            (uint)pHVar22->value);
        uVar28 = (uint)pHVar22->bits;
      }
      (s->br).bit_pos_ = uVar28 + uVar15;
      local_4c = (uint)pHVar22->value;
LAB_00104c10:
      uVar12 = (ulong)local_4c;
      bVar1 = kCmdLut[uVar12].insert_len_extra_bits;
      uVar33 = 0;
      bVar31 = kCmdLut[uVar12].copy_len_extra_bits;
      bVar23 = kCmdLut[uVar12].context;
      uVar2 = kCmdLut[uVar12].insert_len_offset;
      uVar30 = (uint)uVar2;
      uVar3 = kCmdLut[uVar12].copy_len_offset;
      local_48 = (byte *)CONCAT44(local_48._4_4_,(uint)uVar3);
      s->distance_code = (int)kCmdLut[uVar12].distance_code;
      s->distance_context = (uint)bVar23;
      s->dist_htree_index = s->dist_context_map_slice[bVar23];
      uVar28 = 0;
      if (bVar1 != 0) {
        uVar15 = (s->br).bit_pos_;
        uVar28 = 0x40 - uVar15;
        uVar19 = (uint)bVar1;
        if (uVar28 < uVar19) {
          sVar25 = (s->br).avail_in;
          do {
            sVar25 = sVar25 - 1;
            if (sVar25 == 0xffffffffffffffff) goto LAB_00104d4a;
            uVar12 = (s->br).val_;
            pbVar4 = (s->br).next_in;
            (s->br).val_ = uVar12 >> 8;
            uVar12 = (ulong)*pbVar4 << 0x38 | uVar12 >> 8;
            (s->br).val_ = uVar12;
            uVar15 = uVar15 - 8;
            (s->br).bit_pos_ = uVar15;
            (s->br).avail_in = sVar25;
            (s->br).next_in = pbVar4 + 1;
            uVar28 = uVar28 + 8;
          } while (uVar28 < uVar19);
        }
        else {
          uVar12 = br->val_;
        }
        uVar28 = (uint)(uVar12 >> ((byte)uVar15 & 0x3f)) & kBitMask[uVar19];
        (s->br).bit_pos_ = uVar15 + uVar19;
      }
      if (bVar31 != 0) {
        uVar15 = (s->br).bit_pos_;
        uVar33 = 0x40 - uVar15;
        uVar19 = (uint)bVar31;
        if (uVar33 < uVar19) {
          sVar25 = (s->br).avail_in;
          do {
            sVar25 = sVar25 - 1;
            if (sVar25 == 0xffffffffffffffff) goto LAB_00104d4a;
            uVar12 = (s->br).val_;
            pbVar4 = (s->br).next_in;
            (s->br).val_ = uVar12 >> 8;
            uVar27 = (ulong)*pbVar4 << 0x38 | uVar12 >> 8;
            (s->br).val_ = uVar27;
            uVar15 = uVar15 - 8;
            (s->br).bit_pos_ = uVar15;
            (s->br).avail_in = sVar25;
            (s->br).next_in = pbVar4 + 1;
            uVar33 = uVar33 + 8;
          } while (uVar33 < uVar19);
        }
        else {
          uVar27 = br->val_;
        }
        uVar33 = (uint)(uVar27 >> ((byte)uVar15 & 0x3f)) & kBitMask[uVar19];
        (s->br).bit_pos_ = uVar15 + uVar19;
      }
      iVar32 = uVar33 + uVar3;
      s->copy_length = iVar32;
      s->block_length[1] = s->block_length[1] - 1;
      uVar28 = uVar28 + uVar2;
      if ((s->field_0x338 & 0x40) != 0) {
        s->commands[s->commands_size].copy_len = iVar32;
      }
      uVar30 = 0;
      if (uVar28 != 0) {
        s->meta_block_remaining_len = s->meta_block_remaining_len - uVar28;
        uVar30 = uVar28;
LAB_00104dda:
        s->state = BROTLI_STATE_COMMAND_INNER;
        iVar32 = (int)uVar34;
        if (s->trivial_literal_context == 0) {
          uVar34 = (ulong)iVar32;
          uVar16 = s->block_length[0];
          bVar1 = s->ringbuffer[(int)(iVar32 - 1U & s->ringbuffer_mask)];
          bVar31 = s->ringbuffer[(int)(iVar32 - 2U & s->ringbuffer_mask)];
          do {
            bVar23 = bVar1;
            if (uVar16 == 0) {
              iVar32 = SafeDecodeLiteralBlockSwitch(s,(int)uVar34);
              if (iVar32 == 0) goto LAB_00104d63;
              if (s->trivial_literal_context != 0) goto LAB_00104dda;
            }
            pHVar22 = (s->literal_hgroup).htrees
                      [s->context_map_slice
                       [s->context_lookup[(ulong)bVar31 + 0x100] | s->context_lookup[bVar23]]];
            uVar16 = (s->br).bit_pos_;
            if (uVar16 - 0x32 < 0xf) {
              sVar25 = (s->br).avail_in;
              uVar15 = uVar16;
              do {
                sVar25 = sVar25 - 1;
                if (sVar25 == 0xffffffffffffffff) {
                  iVar32 = SafeDecodeSymbol(pHVar22,br,&local_4c);
                  if (iVar32 == 0) goto LAB_00104d63;
                  bVar1 = (byte)local_4c;
                  goto LAB_00105058;
                }
                uVar13 = (s->br).val_;
                pbVar4 = (s->br).next_in;
                (s->br).val_ = uVar13 >> 8;
                uVar13 = (ulong)*pbVar4 << 0x38 | uVar13 >> 8;
                (s->br).val_ = uVar13;
                uVar16 = uVar15 - 8;
                (s->br).bit_pos_ = uVar16;
                (s->br).avail_in = sVar25;
                (s->br).next_in = pbVar4 + 1;
                uVar28 = uVar15 - 0x3a;
                uVar15 = uVar16;
              } while (uVar28 < 0xf);
            }
            else {
              uVar13 = br->val_;
            }
            uVar13 = uVar13 >> ((byte)uVar16 & 0x3f);
            pHVar22 = pHVar22 + (uVar13 & 0xff);
            uVar28 = (uint)pHVar22->bits;
            if (8 < uVar28) {
              uVar16 = uVar16 + 8;
              pHVar22 = pHVar22 + (((uint)(uVar13 >> 8) & 0xffffff & kBitMask[pHVar22->bits - 8] &
                                   0x7f) + (uint)pHVar22->value);
              uVar28 = (uint)pHVar22->bits;
            }
            (s->br).bit_pos_ = uVar28 + uVar16;
            bVar1 = (byte)pHVar22->value;
LAB_00105058:
            s->ringbuffer[uVar34] = bVar1;
            uVar33 = s->ringbuffer_size;
            uVar16 = s->block_length[0] - 1;
            s->block_length[0] = uVar16;
            uVar34 = uVar34 + 1;
            if (uVar33 == (uint)uVar34) {
              s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
              uVar30 = uVar30 - 1;
              BVar10 = BROTLI_DECODER_SUCCESS;
              goto LAB_00104d68;
            }
            uVar30 = uVar30 - 1;
            bVar31 = bVar23;
            if (uVar30 == 0) goto LAB_001050b8;
          } while( true );
        }
        uVar34 = (ulong)iVar32;
        uVar16 = s->block_length[0];
        do {
          if (uVar16 == 0) {
            iVar32 = SafeDecodeLiteralBlockSwitch(s,(int)uVar34);
            if (iVar32 == 0) goto LAB_00104d63;
            if (s->trivial_literal_context == 0) goto LAB_00104dda;
          }
          pHVar22 = s->literal_htree;
          uVar16 = (s->br).bit_pos_;
          if (uVar16 - 0x32 < 0xf) {
            sVar25 = (s->br).avail_in;
            uVar15 = uVar16;
            do {
              sVar25 = sVar25 - 1;
              if (sVar25 == 0xffffffffffffffff) {
                iVar32 = SafeDecodeSymbol(pHVar22,br,&local_4c);
                uVar28 = local_4c;
                if (iVar32 != 0) goto LAB_00104ecb;
                goto LAB_00104d63;
              }
              uVar13 = (s->br).val_;
              pbVar4 = (s->br).next_in;
              (s->br).val_ = uVar13 >> 8;
              uVar13 = (ulong)*pbVar4 << 0x38 | uVar13 >> 8;
              (s->br).val_ = uVar13;
              uVar16 = uVar15 - 8;
              (s->br).bit_pos_ = uVar16;
              (s->br).avail_in = sVar25;
              (s->br).next_in = pbVar4 + 1;
              uVar28 = uVar15 - 0x3a;
              uVar15 = uVar16;
            } while (uVar28 < 0xf);
          }
          else {
            uVar13 = br->val_;
          }
          uVar13 = uVar13 >> ((byte)uVar16 & 0x3f);
          pHVar22 = pHVar22 + (uVar13 & 0xff);
          uVar28 = (uint)pHVar22->bits;
          if (8 < uVar28) {
            uVar16 = uVar16 + 8;
            pHVar22 = pHVar22 + (((uint)(uVar13 >> 8) & 0xffffff & kBitMask[pHVar22->bits - 8] &
                                 0x7f) + (uint)pHVar22->value);
            uVar28 = (uint)pHVar22->bits;
          }
          (s->br).bit_pos_ = uVar28 + uVar16;
          uVar28 = (uint)pHVar22->value;
LAB_00104ecb:
          s->ringbuffer[uVar34] = (uint8_t)uVar28;
          uVar33 = s->ringbuffer_size;
          uVar16 = s->block_length[0] - 1;
          s->block_length[0] = uVar16;
          uVar34 = uVar34 + 1;
          if (uVar33 == (uint)uVar34) {
            s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
            uVar30 = uVar30 - 1;
            BVar10 = BROTLI_DECODER_SUCCESS;
            goto LAB_00104d68;
          }
          uVar30 = uVar30 - 1;
          if (uVar30 == 0) goto LAB_001050b8;
        } while( true );
      }
      goto switchD_00104ae4_caseD_9;
    }
    iVar32 = SafeDecodeCommandBlockSwitch(s,(int)uVar34);
  } while (iVar32 != 0);
  goto LAB_00104d63;
LAB_00104d4a:
  (s->br).val_ = uVar13;
  (s->br).bit_pos_ = uVar16;
LAB_00104d56:
  (s->br).next_in = local_38;
  (s->br).avail_in = local_40;
LAB_00104d63:
  uVar33 = (uint)uVar34;
  BVar10 = BROTLI_DECODER_NEEDS_MORE_INPUT;
  goto LAB_00104d68;
LAB_001050b8:
  uVar33 = (uint)uVar34;
  uVar30 = 0;
  if (s->meta_block_remaining_len < 1) {
    s->state = BROTLI_STATE_METABLOCK_DONE;
    BVar10 = BROTLI_DECODER_SUCCESS;
    uVar30 = 0;
    goto LAB_00104d68;
  }
switchD_00104ae4_caseD_9:
  uVar28 = (uint)uVar34;
  s->state = BROTLI_STATE_COMMAND_POST_DECODE_LITERALS;
  iVar32 = s->distance_code;
  if (iVar32 < 0) {
    if ((s->block_length[2] == 0) && (iVar32 = SafeDecodeDistanceBlockSwitch(s), iVar32 == 0))
    goto LAB_00104d63;
    pHVar22 = (s->distance_hgroup).htrees[s->dist_htree_index];
    pbVar4 = (byte *)(s->br).val_;
    uVar16 = (s->br).bit_pos_;
    pbVar29 = (s->br).next_in;
    local_40 = (s->br).avail_in;
    uVar33 = uVar16 - 0x32;
    pbVar14 = pbVar4;
    uVar15 = uVar16;
    pbVar9 = pbVar29;
    sVar25 = local_40;
    while (uVar33 < 0xf) {
      sVar25 = sVar25 - 1;
      if (sVar25 == 0xffffffffffffffff) {
        local_48 = pbVar29;
        iVar32 = SafeDecodeSymbol(pHVar22,br,&local_4c);
        pbVar29 = local_48;
        uVar33 = local_4c;
        if (iVar32 != 0) goto LAB_0010520d;
        goto LAB_00104d63;
      }
      (s->br).val_ = (ulong)pbVar14 >> 8;
      pbVar14 = (byte *)((ulong)pbVar14 >> 8 | (ulong)*pbVar9 << 0x38);
      (s->br).val_ = (uint64_t)pbVar14;
      (s->br).bit_pos_ = uVar15 - 8;
      (s->br).avail_in = sVar25;
      (s->br).next_in = pbVar9 + 1;
      uVar33 = uVar15 - 0x3a;
      uVar15 = uVar15 - 8;
      pbVar9 = pbVar9 + 1;
    }
    uVar13 = (ulong)pbVar14 >> ((byte)uVar15 & 0x3f);
    pHVar22 = pHVar22 + (uVar13 & 0xff);
    uVar33 = (uint)pHVar22->bits;
    if (8 < uVar33) {
      uVar15 = uVar15 + 8;
      pHVar22 = pHVar22 + (((uint)(uVar13 >> 8) & 0xffffff & kBitMask[pHVar22->bits - 8] & 0x7f) +
                          (uint)pHVar22->value);
      uVar33 = (uint)pHVar22->bits;
    }
    (s->br).bit_pos_ = uVar33 + uVar15;
    uVar33 = (uint)pHVar22->value;
LAB_0010520d:
    uVar15 = s->block_length[2];
    s->block_length[2] = uVar15 - 1;
    s->distance_context = 0;
    if (uVar33 < 0x10) {
      s->distance_code = uVar33;
      if (uVar33 < 4) {
        uVar19 = 1 >> ((byte)uVar33 & 0x1f);
        s->distance_context = uVar19;
        iVar32 = s->dist_rb[~uVar33 + s->dist_rb_idx & 3];
        s->distance_code = iVar32;
        s->dist_rb_idx = s->dist_rb_idx - uVar19;
      }
      else {
        iVar32 = uVar33 - 4;
        iVar20 = 3;
        if (9 < uVar33) {
          iVar32 = uVar33 - 10;
          iVar20 = 10;
        }
        iVar20 = s->dist_rb[iVar20 + s->dist_rb_idx & 3] +
                 (0x605142U >> ((byte)(iVar32 << 2) & 0x1f) & 7) + -3;
        iVar32 = 0x7fffffff;
        if (0 < iVar20) {
          iVar32 = iVar20;
        }
        s->distance_code = iVar32;
        uVar19 = 0;
      }
      goto LAB_00105380;
    }
    bVar1 = *(byte *)((long)s->trivial_literal_contexts + (ulong)uVar33 + 0x20);
    uVar19 = 0;
    uVar18 = 0;
    if (bVar1 != 0) {
      uVar17 = (s->br).bit_pos_;
      uVar18 = 0x40 - uVar17;
      uVar24 = (uint)bVar1;
      if (uVar18 < uVar24) {
        sVar25 = (s->br).avail_in;
        do {
          sVar25 = sVar25 - 1;
          if (sVar25 == 0xffffffffffffffff) {
            s->block_length[2] = uVar15;
            (s->br).val_ = (uint64_t)pbVar4;
            (s->br).bit_pos_ = uVar16;
            local_38 = pbVar29;
            goto LAB_00104d56;
          }
          uVar13 = (s->br).val_;
          pbVar14 = (s->br).next_in;
          (s->br).val_ = uVar13 >> 8;
          uVar27 = (ulong)*pbVar14 << 0x38 | uVar13 >> 8;
          (s->br).val_ = uVar27;
          uVar17 = uVar17 - 8;
          (s->br).bit_pos_ = uVar17;
          (s->br).avail_in = sVar25;
          (s->br).next_in = pbVar14 + 1;
          uVar18 = uVar18 + 8;
          local_38 = pbVar4;
        } while (uVar18 < uVar24);
      }
      else {
        uVar27 = br->val_;
      }
      uVar18 = (uint)(uVar27 >> ((byte)uVar17 & 0x3f)) & kBitMask[uVar24];
      (s->br).bit_pos_ = uVar17 + uVar24;
      local_48 = pbVar29;
    }
    iVar32 = (uVar18 << ((byte)s->distance_postfix_bits & 0x1f)) +
             *(int *)((long)&s->arena + (ulong)uVar33 * 4 + 0x220);
  }
  else {
    uVar19 = (uint)(iVar32 == 0);
    s->distance_context = (uint)(iVar32 == 0);
    uVar30 = s->dist_rb_idx - 1;
    s->dist_rb_idx = uVar30;
    iVar32 = s->dist_rb[uVar30 & 3];
  }
  s->distance_code = iVar32;
LAB_00105380:
  uVar30 = s->max_backward_distance;
  uVar33 = s->max_distance;
  if (uVar33 != uVar30) {
    uVar33 = uVar30;
    if ((int)uVar28 < (int)uVar30) {
      uVar33 = uVar28;
    }
    s->max_distance = uVar33;
  }
  if ((s->field_0x338 & 0x40) != 0) {
    pBVar5 = s->commands;
    sVar25 = s->commands_size;
    pBVar5[sVar25].distance = iVar32;
    pBVar5[sVar25].position = uVar28;
    pBVar5[sVar25].max_distance = uVar33;
    s->commands_size = sVar25 + 1;
  }
  uVar30 = s->copy_length;
  uVar13 = (ulong)uVar30;
  if ((int)uVar33 < iVar32) {
    if (0x7ffffffc < iVar32) {
      return BROTLI_DECODER_ERROR_FORMAT_DISTANCE;
    }
    if (0x14 < uVar30 - 4) {
      return BROTLI_DECODER_ERROR_FORMAT_DICTIONARY;
    }
    pBVar6 = s->dictionary;
    pBVar7 = s->transforms;
    uVar18 = kBitMask[pBVar6->size_bits_by_length[uVar13]];
    iVar20 = (int)(iVar32 + ~uVar33) >> (pBVar6->size_bits_by_length[uVar13] & 0x1f);
    uVar16 = pBVar6->offsets_by_length[uVar13];
    s->dist_rb_idx = s->dist_rb_idx + uVar19;
    if (pBVar6->data == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET;
    }
    if ((int)pBVar7->num_transforms <= iVar20) {
      return BROTLI_DECODER_ERROR_FORMAT_TRANSFORM;
    }
    puVar26 = pBVar6->data + (long)(int)((uVar18 & iVar32 + ~uVar33) * uVar30) + (long)(int)uVar16;
    if (iVar20 == pBVar7->cutOffTransforms[0]) {
      memcpy(s->ringbuffer + (int)uVar28,puVar26,uVar13);
      uVar33 = uVar30;
    }
    else {
      uVar33 = BrotliTransformDictionaryWord(s->ringbuffer + (int)uVar28,puVar26,uVar30,pBVar7);
    }
    s->meta_block_remaining_len = s->meta_block_remaining_len - uVar33;
    uVar33 = uVar28 + uVar33;
    if (s->ringbuffer_size <= (int)uVar33) {
      s->state = BROTLI_STATE_COMMAND_POST_WRITE_1;
      goto LAB_00105614;
    }
  }
  else {
    uVar18 = uVar28 - iVar32 & s->ringbuffer_mask;
    puVar26 = s->ringbuffer;
    lVar11 = (long)(int)uVar28;
    uVar33 = uVar30 + uVar28;
    uVar19 = s->dist_rb_idx;
    s->dist_rb[uVar19 & 3] = iVar32;
    s->dist_rb_idx = uVar19 + 1;
    s->meta_block_remaining_len = s->meta_block_remaining_len - uVar30;
    uVar8 = *(undefined8 *)(puVar26 + (int)uVar18 + 8);
    *(undefined8 *)(puVar26 + lVar11) = *(undefined8 *)(puVar26 + (int)uVar18);
    *(undefined8 *)(puVar26 + lVar11 + 8) = uVar8;
    if (((((int)uVar28 < (int)(uVar18 + uVar30)) && ((int)uVar18 < (int)uVar33)) ||
        (s->ringbuffer_size <= (int)uVar33)) || (s->ringbuffer_size <= (int)(uVar18 + uVar30))) {
LAB_001054d7:
      iVar32 = uVar28 - s->ringbuffer_size;
      iVar20 = -(int)lVar11;
      while (iVar21 = (int)uVar13, 0 < iVar21) {
        s->ringbuffer[lVar11] = s->ringbuffer[(int)lVar11 - s->distance_code & s->ringbuffer_mask];
        lVar11 = lVar11 + 1;
        iVar20 = iVar20 + -1;
        uVar13 = (ulong)(iVar21 - 1);
        iVar32 = iVar32 + 1;
        if (iVar32 == 0) {
          uVar33 = -iVar20;
          s->state = BROTLI_STATE_COMMAND_POST_WRITE_2;
          uVar30 = iVar21 - 1;
          goto LAB_00105614;
        }
      }
      uVar33 = -iVar20;
      uVar34 = (ulong)uVar33;
      uVar30 = iVar21 - 1;
      uVar13 = (ulong)uVar30;
      if (s->meta_block_remaining_len < 1) {
        s->state = BROTLI_STATE_METABLOCK_DONE;
LAB_00105614:
        BVar10 = BROTLI_DECODER_SUCCESS;
LAB_00104d68:
        s->pos = uVar33;
        s->loop_counter = uVar30;
        return BVar10;
      }
      goto switchD_00104ae4_caseD_7;
    }
    if (0x10 < (int)uVar30) {
      if (uVar30 < 0x21) {
        uVar8 = *(undefined8 *)(puVar26 + (long)(int)uVar18 + 0x18);
        *(undefined8 *)(puVar26 + lVar11 + 0x10) =
             *(undefined8 *)(puVar26 + (long)(int)uVar18 + 0x10);
        *(undefined8 *)(puVar26 + lVar11 + 0x18) = uVar8;
      }
      else {
        memcpy(puVar26 + lVar11 + 0x10,puVar26 + (long)(int)uVar18 + 0x10,(ulong)(uVar30 - 0x10));
      }
    }
  }
  if (s->meta_block_remaining_len < 1) {
    s->state = BROTLI_STATE_METABLOCK_DONE;
    BVar10 = BROTLI_DECODER_SUCCESS;
    goto LAB_00104d68;
  }
  uVar34 = (ulong)uVar33;
  goto switchD_00104ae4_caseD_7;
}

Assistant:

static BROTLI_INLINE BrotliDecoderErrorCode ProcessCommandsInternal(
    int safe, BrotliDecoderState* s) {
  int pos = s->pos;
  int i = s->loop_counter;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
  BrotliBitReader* br = &s->br;
  if (!CheckInputAmount(safe, br, 28)) {
    result = BROTLI_DECODER_NEEDS_MORE_INPUT;
    goto saveStateAndReturn;
  }
  if (!safe) {
    BROTLI_UNUSED(BrotliWarmupBitReader(br));
  }

  /* Jump into state machine. */
  if (s->state == BROTLI_STATE_COMMAND_BEGIN) {
    goto CommandBegin;
  } else if (s->state == BROTLI_STATE_COMMAND_INNER) {
    goto CommandInner;
  } else if (s->state == BROTLI_STATE_COMMAND_POST_DECODE_LITERALS) {
    goto CommandPostDecodeLiterals;
  } else if (s->state == BROTLI_STATE_COMMAND_POST_WRAP_COPY) {
    goto CommandPostWrapCopy;
  } else {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }

CommandBegin:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_BEGIN;
  }
  if (!CheckInputAmount(safe, br, 28)) {  /* 156 bits + 7 bytes */
    s->state = BROTLI_STATE_COMMAND_BEGIN;
    result = BROTLI_DECODER_NEEDS_MORE_INPUT;
    goto saveStateAndReturn;
  }
  if (BROTLI_PREDICT_FALSE(s->block_length[1] == 0)) {
    BROTLI_SAFE(DecodeCommandBlockSwitch(s, pos));
    goto CommandBegin;
  }
  /* Read the insert/copy length in the command. */
  BROTLI_SAFE(ReadCommand(s, br, &i));
  BROTLI_LOG(("[ProcessCommandsInternal] pos = %d insert = %d copy = %d\n",
              pos, i, s->copy_length));
  /* Save backward reference info if needed */
  if (s->save_info_for_recompression) {
    s->commands[s->commands_size].copy_len = s->copy_length;
  }
  if (i == 0) {
    goto CommandPostDecodeLiterals;
  }
  s->meta_block_remaining_len -= i;

CommandInner:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_INNER;
  }
  /* Read the literals in the command. */
  if (s->trivial_literal_context) {
    uint32_t bits;
    uint32_t value;
    PreloadSymbol(safe, s->literal_htree, br, &bits, &value);
    do {
      if (!CheckInputAmount(safe, br, 28)) {  /* 162 bits + 7 bytes */
        s->state = BROTLI_STATE_COMMAND_INNER;
        result = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto saveStateAndReturn;
      }
      if (BROTLI_PREDICT_FALSE(s->block_length[0] == 0)) {
        BROTLI_SAFE(DecodeLiteralBlockSwitch(s, pos));
        PreloadSymbol(safe, s->literal_htree, br, &bits, &value);
        if (!s->trivial_literal_context) goto CommandInner;
      }
      if (!safe) {
        s->ringbuffer[pos] =
            (uint8_t)ReadPreloadedSymbol(s->literal_htree, br, &bits, &value);
      } else {
        uint32_t literal;
        if (!SafeReadSymbol(s->literal_htree, br, &literal)) {
          result = BROTLI_DECODER_NEEDS_MORE_INPUT;
          goto saveStateAndReturn;
        }
        s->ringbuffer[pos] = (uint8_t)literal;
      }
      --s->block_length[0];
      BROTLI_LOG_ARRAY_INDEX(s->ringbuffer, pos);
      ++pos;
      if (BROTLI_PREDICT_FALSE(pos == s->ringbuffer_size)) {
        s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
        --i;
        goto saveStateAndReturn;
      }
    } while (--i != 0);
  } else {
    uint8_t p1 = s->ringbuffer[(pos - 1) & s->ringbuffer_mask];
    uint8_t p2 = s->ringbuffer[(pos - 2) & s->ringbuffer_mask];
    do {
      const HuffmanCode* hc;
      uint8_t context;
      if (!CheckInputAmount(safe, br, 28)) {  /* 162 bits + 7 bytes */
        s->state = BROTLI_STATE_COMMAND_INNER;
        result = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto saveStateAndReturn;
      }
      if (BROTLI_PREDICT_FALSE(s->block_length[0] == 0)) {
        BROTLI_SAFE(DecodeLiteralBlockSwitch(s, pos));
        if (s->trivial_literal_context) goto CommandInner;
      }
      context = BROTLI_CONTEXT(p1, p2, s->context_lookup);
      BROTLI_LOG_UINT(context);
      hc = s->literal_hgroup.htrees[s->context_map_slice[context]];
      p2 = p1;
      if (!safe) {
        p1 = (uint8_t)ReadSymbol(hc, br);
      } else {
        uint32_t literal;
        if (!SafeReadSymbol(hc, br, &literal)) {
          result = BROTLI_DECODER_NEEDS_MORE_INPUT;
          goto saveStateAndReturn;
        }
        p1 = (uint8_t)literal;
      }
      s->ringbuffer[pos] = p1;
      --s->block_length[0];
      BROTLI_LOG_UINT(s->context_map_slice[context]);
      BROTLI_LOG_ARRAY_INDEX(s->ringbuffer, pos & s->ringbuffer_mask);
      ++pos;
      if (BROTLI_PREDICT_FALSE(pos == s->ringbuffer_size)) {
        s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
        --i;
        goto saveStateAndReturn;
      }
    } while (--i != 0);
  }
  BROTLI_LOG_UINT(s->meta_block_remaining_len);
  if (BROTLI_PREDICT_FALSE(s->meta_block_remaining_len <= 0)) {
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  }

CommandPostDecodeLiterals:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_POST_DECODE_LITERALS;
  }
  if (s->distance_code >= 0) {
    /* Implicit distance case. */
    s->distance_context = s->distance_code ? 0 : 1;
    --s->dist_rb_idx;
    s->distance_code = s->dist_rb[s->dist_rb_idx & 3];
  } else {
    /* Read distance code in the command, unless it was implicitly zero. */
    if (BROTLI_PREDICT_FALSE(s->block_length[2] == 0)) {
      BROTLI_SAFE(DecodeDistanceBlockSwitch(s));
    }
    BROTLI_SAFE(ReadDistance(s, br));
  }
  BROTLI_LOG(("[ProcessCommandsInternal] pos = %d distance = %d\n",
              pos, s->distance_code));
  if (s->max_distance != s->max_backward_distance) {
    s->max_distance =
        (pos < s->max_backward_distance) ? pos : s->max_backward_distance;
  }
  /* Save backward reference info if needed */
  if (s->save_info_for_recompression) {
    s->commands[s->commands_size].distance = s->distance_code;
    s->commands[s->commands_size].position = pos;
    s->commands[s->commands_size].max_distance = s->max_distance;
    ++s->commands_size;
  }
  i = s->copy_length;
  /* Apply copy of LZ77 back-reference, or static dictionary reference if
     the distance is larger than the max LZ77 distance */
  if (s->distance_code > s->max_distance) {
    /* The maximum allowed distance is BROTLI_MAX_ALLOWED_DISTANCE = 0x7FFFFFFC.
       With this choice, no signed overflow can occur after decoding
       a special distance code (e.g., after adding 3 to the last distance). */
    if (s->distance_code > BROTLI_MAX_ALLOWED_DISTANCE) {
      BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
          "len: %d bytes left: %d\n",
          pos, s->distance_code, i, s->meta_block_remaining_len));
      return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_DISTANCE);
    }
    if (i >= BROTLI_MIN_DICTIONARY_WORD_LENGTH &&
        i <= BROTLI_MAX_DICTIONARY_WORD_LENGTH) {
      int address = s->distance_code - s->max_distance - 1;
      const BrotliDictionary* words = s->dictionary;
      const BrotliTransforms* transforms = s->transforms;
      int offset = (int)s->dictionary->offsets_by_length[i];
      uint32_t shift = s->dictionary->size_bits_by_length[i];

      int mask = (int)BitMask(shift);
      int word_idx = address & mask;
      int transform_idx = address >> shift;
      /* Compensate double distance-ring-buffer roll. */
      s->dist_rb_idx += s->distance_context;
      offset += word_idx * i;
      if (BROTLI_PREDICT_FALSE(!words->data)) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET);
      }
      if (transform_idx < (int)transforms->num_transforms) {
        const uint8_t* word = &words->data[offset];
        int len = i;
        if (transform_idx == transforms->cutOffTransforms[0]) {
          memcpy(&s->ringbuffer[pos], word, (size_t)len);
          BROTLI_LOG(("[ProcessCommandsInternal] dictionary word: [%.*s]\n",
                      len, word));
        } else {
          len = BrotliTransformDictionaryWord(&s->ringbuffer[pos], word, len,
              transforms, transform_idx);
          BROTLI_LOG(("[ProcessCommandsInternal] dictionary word: [%.*s],"
                      " transform_idx = %d, transformed: [%.*s]\n",
                      i, word, transform_idx, len, &s->ringbuffer[pos]));
        }
        pos += len;
        s->meta_block_remaining_len -= len;
        if (pos >= s->ringbuffer_size) {
          s->state = BROTLI_STATE_COMMAND_POST_WRITE_1;
          goto saveStateAndReturn;
        }
      } else {
        BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
            "len: %d bytes left: %d\n",
            pos, s->distance_code, i, s->meta_block_remaining_len));
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_TRANSFORM);
      }
    } else {
      BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
          "len: %d bytes left: %d\n",
          pos, s->distance_code, i, s->meta_block_remaining_len));
      return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_DICTIONARY);
    }
  } else {
    int src_start = (pos - s->distance_code) & s->ringbuffer_mask;
    uint8_t* copy_dst = &s->ringbuffer[pos];
    uint8_t* copy_src = &s->ringbuffer[src_start];
    int dst_end = pos + i;
    int src_end = src_start + i;
    /* Update the recent distances cache. */
    s->dist_rb[s->dist_rb_idx & 3] = s->distance_code;
    ++s->dist_rb_idx;
    s->meta_block_remaining_len -= i;
    /* There are 32+ bytes of slack in the ring-buffer allocation.
       Also, we have 16 short codes, that make these 16 bytes irrelevant
       in the ring-buffer. Let's copy over them as a first guess. */
    memmove16(copy_dst, copy_src);
    if (src_end > pos && dst_end > src_start) {
      /* Regions intersect. */
      goto CommandPostWrapCopy;
    }
    if (dst_end >= s->ringbuffer_size || src_end >= s->ringbuffer_size) {
      /* At least one region wraps. */
      goto CommandPostWrapCopy;
    }
    pos += i;
    if (i > 16) {
      if (i > 32) {
        memcpy(copy_dst + 16, copy_src + 16, (size_t)(i - 16));
      } else {
        /* This branch covers about 45% cases.
           Fixed size short copy allows more compiler optimizations. */
        memmove16(copy_dst + 16, copy_src + 16);
      }
    }
  }
  BROTLI_LOG_UINT(s->meta_block_remaining_len);
  if (s->meta_block_remaining_len <= 0) {
    /* Next metablock, if any. */
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  } else {
    goto CommandBegin;
  }
CommandPostWrapCopy:
  {
    int wrap_guard = s->ringbuffer_size - pos;
    while (--i >= 0) {
      s->ringbuffer[pos] =
          s->ringbuffer[(pos - s->distance_code) & s->ringbuffer_mask];
      ++pos;
      if (BROTLI_PREDICT_FALSE(--wrap_guard == 0)) {
        s->state = BROTLI_STATE_COMMAND_POST_WRITE_2;
        goto saveStateAndReturn;
      }
    }
  }
  if (s->meta_block_remaining_len <= 0) {
    /* Next metablock, if any. */
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  } else {
    goto CommandBegin;
  }

saveStateAndReturn:
  s->pos = pos;
  s->loop_counter = i;
  return result;
}